

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Vector<unsigned_int,_2> __thiscall
gl4cts::Math::equal<2>(Math *this,Vector<double,_2> *left,Vector<double,_2> *right)

{
  Vector<bool,_2> local_12;
  
  tcu::equal<double,2>(left,right);
  convertBvecToUvec<2>(&local_12);
  return (Vector<unsigned_int,_2>)(uint  [2])this;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> equal(const tcu::Vector<glw::GLdouble, Size>& left,
											const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::equal(left, right));
}